

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O0

bool crnlib::prefix_coding::generate_decoder_tables
               (uint num_syms,uint8 *pCodesizes,decoder_tables *pTables,uint table_bits)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  uint32 b;
  uint uVar6;
  uint uVar7;
  unsigned_short *puVar8;
  uint *puVar9;
  byte bVar10;
  uint local_164;
  uint local_160;
  uint i_5;
  uint i_4;
  uint i_3;
  uint t;
  uint j;
  uint sym_index;
  uint code_1;
  uint val_ptr;
  uint max_code;
  uint min_code;
  uint fillnum;
  uint fillsize;
  uint codesize;
  uint table_size;
  uint sorted_pos;
  uint c_1;
  uint i_2;
  uint n;
  uint i_1;
  uint min_code_size;
  uint max_code_size;
  uint total_used_syms;
  uint code;
  uint sorted_positions [17];
  uint local_bc;
  uint c;
  uint i;
  uint num_codes [17];
  uint auStack_68 [2];
  uint min_codes [16];
  uint table_bits_local;
  decoder_tables *pTables_local;
  uint8 *pCodesizes_local;
  uint num_syms_local;
  
  if ((num_syms == 0) || (0xb < table_bits)) {
    pCodesizes_local._7_1_ = false;
  }
  else {
    pTables->m_num_syms = num_syms;
    min_codes[0xf] = table_bits;
    utils::zero_object<unsigned_int[17]>((uint (*) [17])&c);
    for (local_bc = 0; local_bc < num_syms; local_bc = local_bc + 1) {
      sorted_positions[0x10] = (uint)pCodesizes[local_bc];
      if (sorted_positions[0x10] != 0) {
        (&c)[sorted_positions[0x10]] = (&c)[sorted_positions[0x10]] + 1;
      }
    }
    max_code_size = 0;
    min_code_size = 0;
    i_1 = 0;
    n = 0xffffffff;
    for (i_2 = 1; i_2 < 0x11; i_2 = i_2 + 1) {
      uVar2 = (&c)[i_2];
      if (uVar2 == 0) {
        pTables->m_max_codes[i_2 - 1] = 0;
      }
      else {
        n = math::minimum<unsigned_int>(n,i_2);
        i_1 = math::maximum<unsigned_int>(i_1,i_2);
        auStack_68[i_2 - 1] = max_code_size;
        pTables->m_max_codes[i_2 - 1] = (max_code_size + uVar2) - 1;
        pTables->m_max_codes[i_2 - 1] =
             (pTables->m_max_codes[i_2 - 1] << (0x10U - (char)i_2 & 0x1f) |
             (1 << (0x10U - (char)i_2 & 0x1f)) - 1U) + 1;
        pTables->m_val_ptrs[i_2 - 1] = min_code_size;
        (&total_used_syms)[i_2] = min_code_size;
        max_code_size = uVar2 + max_code_size;
        min_code_size = uVar2 + min_code_size;
      }
      max_code_size = max_code_size << 1;
    }
    pTables->m_total_used_syms = min_code_size;
    if (pTables->m_cur_sorted_symbol_order_size < min_code_size) {
      pTables->m_cur_sorted_symbol_order_size = min_code_size;
      bVar5 = math::is_power_of_2(min_code_size);
      if (!bVar5) {
        b = math::next_pow2(min_code_size);
        uVar6 = math::minimum<unsigned_int>(num_syms,b);
        pTables->m_cur_sorted_symbol_order_size = uVar6;
      }
      if (pTables->m_sorted_symbol_order != (uint16 *)0x0) {
        crnlib_delete_array<unsigned_short>(pTables->m_sorted_symbol_order);
        pTables->m_sorted_symbol_order = (uint16 *)0x0;
      }
      puVar8 = crnlib_new_array<unsigned_short>(pTables->m_cur_sorted_symbol_order_size);
      pTables->m_sorted_symbol_order = puVar8;
    }
    pTables->m_min_code_size = (uint8)n;
    pTables->m_max_code_size = (uint8)i_1;
    for (sorted_pos = 0; sorted_pos < num_syms; sorted_pos = sorted_pos + 1) {
      uVar6 = (uint)pCodesizes[sorted_pos];
      if (uVar6 != 0) {
        uVar3 = (&total_used_syms)[uVar6];
        (&total_used_syms)[uVar6] = uVar3 + 1;
        pTables->m_sorted_symbol_order[uVar3] = (uint16)sorted_pos;
      }
    }
    if (min_codes[0xf] <= pTables->m_min_code_size) {
      min_codes[0xf] = 0;
    }
    pTables->m_table_bits = min_codes[0xf];
    if (min_codes[0xf] != 0) {
      uVar6 = 1 << ((byte)min_codes[0xf] & 0x1f);
      if (pTables->m_cur_lookup_size < uVar6) {
        pTables->m_cur_lookup_size = uVar6;
        if (pTables->m_lookup != (uint32 *)0x0) {
          crnlib_delete_array<unsigned_int>(pTables->m_lookup);
          pTables->m_lookup = (uint32 *)0x0;
        }
        puVar9 = crnlib_new_array<unsigned_int>(uVar6);
        pTables->m_lookup = puVar9;
      }
      memset(pTables->m_lookup,0xff,(1L << ((byte)min_codes[0xf] & 0x3f)) << 2);
      for (fillnum = 1; fillnum <= min_codes[0xf]; fillnum = fillnum + 1) {
        if ((&c)[fillnum] != 0) {
          bVar10 = (char)min_codes[0xf] - (char)fillnum;
          uVar2 = auStack_68[fillnum - 1];
          uVar7 = decoder_tables::get_unshifted_max_code(pTables,fillnum);
          iVar4 = pTables->m_val_ptrs[fillnum - 1];
          for (j = uVar2; j <= uVar7; j = j + 1) {
            uVar1 = pTables->m_sorted_symbol_order[(iVar4 + j) - uVar2];
            for (i_3 = 0; i_3 < (uint)(1 << (bVar10 & 0x1f)); i_3 = i_3 + 1) {
              pTables->m_lookup[i_3 + (j << (bVar10 & 0x1f))] = (uint)uVar1 | fillnum << 0x10;
            }
          }
        }
      }
    }
    for (i_5 = 0; i_5 < 0x10; i_5 = i_5 + 1) {
      pTables->m_val_ptrs[i_5] = pTables->m_val_ptrs[i_5] - auStack_68[i_5];
    }
    pTables->m_table_max_code = 0;
    pTables->m_decode_start_code_size = (uint)pTables->m_min_code_size;
    if (min_codes[0xf] != 0) {
      for (local_160 = min_codes[0xf]; local_160 != 0; local_160 = local_160 - 1) {
        if ((&c)[local_160] != 0) {
          pTables->m_table_max_code = pTables->m_max_codes[local_160 - 1];
          break;
        }
      }
      if (local_160 != 0) {
        pTables->m_decode_start_code_size = min_codes[0xf] + 1;
        do {
          local_164 = min_codes[0xf] + 1;
          if (i_1 < local_164) goto LAB_002163ce;
          min_codes[0xf] = local_164;
        } while ((&c)[local_164] == 0);
        pTables->m_decode_start_code_size = local_164;
      }
    }
LAB_002163ce:
    pTables->m_max_codes[0x10] = 0xffffffff;
    pTables->m_val_ptrs[0x10] = 0xfffff;
    pTables->m_table_shift = 0x20 - pTables->m_table_bits;
    pCodesizes_local._7_1_ = true;
  }
  return pCodesizes_local._7_1_;
}

Assistant:

bool generate_decoder_tables(uint num_syms, const uint8* pCodesizes, decoder_tables* pTables, uint table_bits) {
  uint min_codes[cMaxExpectedCodeSize];

  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  pTables->m_num_syms = num_syms;

  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint sorted_positions[cMaxExpectedCodeSize + 1];

  uint code = 0;

  uint total_used_syms = 0;
  uint max_code_size = 0;
  uint min_code_size = UINT_MAX;
  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint n = num_codes[i];

    if (!n)
      pTables->m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = code;

      pTables->m_max_codes[i - 1] = code + n - 1;
      pTables->m_max_codes[i - 1] = 1 + ((pTables->m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      pTables->m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      code += n;
      total_used_syms += n;
    }

    code <<= 1;
  }

  pTables->m_total_used_syms = total_used_syms;

  if (total_used_syms > pTables->m_cur_sorted_symbol_order_size) {
    pTables->m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      pTables->m_cur_sorted_symbol_order_size = math::minimum<uint>(num_syms, math::next_pow2(total_used_syms));

    if (pTables->m_sorted_symbol_order) {
      crnlib_delete_array(pTables->m_sorted_symbol_order);
      pTables->m_sorted_symbol_order = NULL;
    }

    pTables->m_sorted_symbol_order = crnlib_new_array<uint16>(pTables->m_cur_sorted_symbol_order_size);
  }

  pTables->m_min_code_size = static_cast<uint8>(min_code_size);
  pTables->m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(num_codes[c]);

      uint sorted_pos = sorted_positions[c]++;

      CRNLIB_ASSERT(sorted_pos < total_used_syms);

      pTables->m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= pTables->m_min_code_size)
    table_bits = 0;
  pTables->m_table_bits = table_bits;

  if (table_bits) {
    uint table_size = 1 << table_bits;
    if (table_size > pTables->m_cur_lookup_size) {
      pTables->m_cur_lookup_size = table_size;

      if (pTables->m_lookup) {
        crnlib_delete_array(pTables->m_lookup);
        pTables->m_lookup = NULL;
      }

      pTables->m_lookup = crnlib_new_array<uint32>(table_size);
    }

    memset(pTables->m_lookup, 0xFF, static_cast<uint>(sizeof(pTables->m_lookup[0])) * (1UL << table_bits));

    for (uint codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint fillsize = table_bits - codesize;
      const uint fillnum = 1 << fillsize;

      const uint min_code = min_codes[codesize - 1];
      const uint max_code = pTables->get_unshifted_max_code(codesize);
      const uint val_ptr = pTables->m_val_ptrs[codesize - 1];

      for (uint code = min_code; code <= max_code; code++) {
        const uint sym_index = pTables->m_sorted_symbol_order[val_ptr + code - min_code];
        CRNLIB_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint j = 0; j < fillnum; j++) {
          const uint t = j + (code << fillsize);

          CRNLIB_ASSERT(t < (1U << table_bits));

          CRNLIB_ASSERT(pTables->m_lookup[t] == cUINT32_MAX);

          pTables->m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint i = 0; i < cMaxExpectedCodeSize; i++)
    pTables->m_val_ptrs[i] -= min_codes[i];

  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = pTables->m_min_code_size;

  if (table_bits) {
    uint i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        pTables->m_table_max_code = pTables->m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      pTables->m_decode_start_code_size = table_bits + 1;
      for (uint i = table_bits + 1; i <= max_code_size; i++) {
        if (num_codes[i]) {
          pTables->m_decode_start_code_size = i;
          break;
        }
      }
    }
  }

  // sentinels
  pTables->m_max_codes[cMaxExpectedCodeSize] = UINT_MAX;
  pTables->m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  pTables->m_table_shift = 32 - pTables->m_table_bits;

  return true;
}